

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_py_generator.cc
# Opt level: O2

void __thiscall t_py_generator::generate_service_server(t_py_generator *this,t_service *tservice)

{
  ofstream_with_content_based_conditional_update *os;
  int *piVar1;
  ostream *poVar2;
  char *pcVar3;
  string *tservice_00;
  pointer pptVar4;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string extends_processor;
  string extends;
  string local_168;
  string local_148;
  _Vector_base<t_function_*,_std::allocator<t_function_*>_> local_128;
  allocator local_110 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&local_128,&tservice->functions_
            );
  std::__cxx11::string::string((string *)&local_f0,"",local_110);
  std::__cxx11::string::string((string *)local_110,"",(allocator *)&local_168);
  if (tservice->extends_ != (t_service *)0x0) {
    type_name_abi_cxx11_(&local_168,this,&tservice->extends_->super_t_type);
    std::__cxx11::string::operator=((string *)&local_f0,(string *)&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    std::operator+(&local_168,&local_f0,".Processor, ");
    std::__cxx11::string::operator=((string *)local_110,(string *)&local_168);
    std::__cxx11::string::~string((string *)&local_168);
  }
  os = &this->f_service_;
  poVar2 = std::operator<<((ostream *)os,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  if (this->gen_zope_interface_ == true) {
    poVar2 = std::operator<<((ostream *)os,"@implementer(Iface)");
    poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    poVar2 = std::operator<<(poVar2,"class Processor(");
    poVar2 = std::operator<<(poVar2,(string *)local_110);
    pcVar3 = "TProcessor):";
  }
  else {
    poVar2 = std::operator<<((ostream *)os,"class Processor(");
    poVar2 = std::operator<<(poVar2,(string *)local_110);
    pcVar3 = "Iface, TProcessor):";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  poVar2 = t_generator::indent(&this->super_t_generator,(ostream *)os);
  poVar2 = std::operator<<(poVar2,"def __init__(self, handler):");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  if (local_f0._M_string_length == 0) {
    if (this->gen_zope_interface_ == false) {
      t_generator::indent_abi_cxx11_(&local_168,&this->super_t_generator);
      poVar2 = std::operator<<((ostream *)os,(string *)&local_168);
      poVar2 = std::operator<<(poVar2,"self._handler = handler");
      std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    }
    else {
      t_generator::indent_abi_cxx11_(&local_168,&this->super_t_generator);
      poVar2 = std::operator<<((ostream *)os,(string *)&local_168);
      poVar2 = std::operator<<(poVar2,"self._handler = Iface(handler)");
      std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    }
    std::__cxx11::string::~string((string *)&local_168);
    t_generator::indent_abi_cxx11_(&local_168,&this->super_t_generator);
    poVar2 = std::operator<<((ostream *)os,(string *)&local_168);
    poVar2 = std::operator<<(poVar2,"self._processMap = {}");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  }
  else if (this->gen_zope_interface_ == false) {
    t_generator::indent_abi_cxx11_(&local_168,&this->super_t_generator);
    poVar2 = std::operator<<((ostream *)os,(string *)&local_168);
    poVar2 = std::operator<<(poVar2,(string *)&local_f0);
    poVar2 = std::operator<<(poVar2,".Processor.__init__(self, handler)");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  }
  else {
    t_generator::indent_abi_cxx11_(&local_168,&this->super_t_generator);
    poVar2 = std::operator<<((ostream *)os,(string *)&local_168);
    poVar2 = std::operator<<(poVar2,(string *)&local_f0);
    poVar2 = std::operator<<(poVar2,".Processor.__init__(self, Iface(handler))");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  }
  std::__cxx11::string::~string((string *)&local_168);
  for (pptVar4 = local_128._M_impl.super__Vector_impl_data._M_start;
      pptVar4 != local_128._M_impl.super__Vector_impl_data._M_finish; pptVar4 = pptVar4 + 1) {
    t_generator::indent_abi_cxx11_(&local_168,&this->super_t_generator);
    poVar2 = std::operator<<((ostream *)os,(string *)&local_168);
    poVar2 = std::operator<<(poVar2,"self._processMap[\"");
    poVar2 = std::operator<<(poVar2,(string *)&(*pptVar4)->name_);
    poVar2 = std::operator<<(poVar2,"\"] = Processor.process_");
    poVar2 = std::operator<<(poVar2,(string *)&(*pptVar4)->name_);
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_168);
  }
  t_generator::indent_abi_cxx11_(&local_168,&this->super_t_generator);
  poVar2 = std::operator<<((ostream *)os,(string *)&local_168);
  poVar2 = std::operator<<(poVar2,"self._on_message_begin = None");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_168);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  std::operator<<((ostream *)os,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_168,&this->super_t_generator);
  poVar2 = std::operator<<((ostream *)os,(string *)&local_168);
  poVar2 = std::operator<<(poVar2,"def on_message_begin(self, func):");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_168);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_168,&this->super_t_generator);
  poVar2 = std::operator<<((ostream *)os,(string *)&local_168);
  poVar2 = std::operator<<(poVar2,"self._on_message_begin = func");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_168);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  std::operator<<((ostream *)os,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_168,&this->super_t_generator);
  poVar2 = std::operator<<((ostream *)os,(string *)&local_168);
  poVar2 = std::operator<<(poVar2,"def process(self, iprot, oprot):");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_168);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_168,&this->super_t_generator);
  poVar2 = std::operator<<((ostream *)os,(string *)&local_168);
  poVar2 = std::operator<<(poVar2,"(name, type, seqid) = iprot.readMessageBegin()");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_168);
  t_generator::indent_abi_cxx11_(&local_168,&this->super_t_generator);
  poVar2 = std::operator<<((ostream *)os,(string *)&local_168);
  poVar2 = std::operator<<(poVar2,"if self._on_message_begin:");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_168);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_168,&this->super_t_generator);
  poVar2 = std::operator<<((ostream *)os,(string *)&local_168);
  poVar2 = std::operator<<(poVar2,"self._on_message_begin(name, type, seqid)");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_168);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_168,&this->super_t_generator);
  poVar2 = std::operator<<((ostream *)os,(string *)&local_168);
  poVar2 = std::operator<<(poVar2,"if name not in self._processMap:");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_168);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + 1;
  t_generator::indent_abi_cxx11_(&local_168,&this->super_t_generator);
  poVar2 = std::operator<<((ostream *)os,(string *)&local_168);
  poVar2 = std::operator<<(poVar2,"iprot.skip(TType.STRUCT)");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_148,&this->super_t_generator);
  poVar2 = std::operator<<(poVar2,(string *)&local_148);
  poVar2 = std::operator<<(poVar2,"iprot.readMessageEnd()");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_50,&this->super_t_generator);
  poVar2 = std::operator<<(poVar2,(string *)&local_50);
  poVar2 = std::operator<<(poVar2,
                           "x = TApplicationException(TApplicationException.UNKNOWN_METHOD, \'Unknown function %s\' % (name))"
                          );
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_70,&this->super_t_generator);
  poVar2 = std::operator<<(poVar2,(string *)&local_70);
  poVar2 = std::operator<<(poVar2,"oprot.writeMessageBegin(name, TMessageType.EXCEPTION, seqid)");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_90,&this->super_t_generator);
  poVar2 = std::operator<<(poVar2,(string *)&local_90);
  poVar2 = std::operator<<(poVar2,"x.write(oprot)");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_b0,&this->super_t_generator);
  poVar2 = std::operator<<(poVar2,(string *)&local_b0);
  poVar2 = std::operator<<(poVar2,"oprot.writeMessageEnd()");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_d0,&this->super_t_generator);
  poVar2 = std::operator<<(poVar2,(string *)&local_d0);
  poVar2 = std::operator<<(poVar2,"oprot.trans.flush()");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_168);
  if (this->gen_twisted_ == true) {
    t_generator::indent_abi_cxx11_(&local_168,&this->super_t_generator);
    poVar2 = std::operator<<((ostream *)os,(string *)&local_168);
    poVar2 = std::operator<<(poVar2,"return defer.succeed(None)");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  }
  else {
    t_generator::indent_abi_cxx11_(&local_168,&this->super_t_generator);
    poVar2 = std::operator<<((ostream *)os,(string *)&local_168);
    poVar2 = std::operator<<(poVar2,"return");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  }
  std::__cxx11::string::~string((string *)&local_168);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  t_generator::indent_abi_cxx11_(&local_168,&this->super_t_generator);
  poVar2 = std::operator<<((ostream *)os,(string *)&local_168);
  poVar2 = std::operator<<(poVar2,"else:");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_168);
  if ((this->gen_twisted_ == false) && (this->gen_tornado_ != true)) {
    t_generator::indent_abi_cxx11_(&local_168,&this->super_t_generator);
    poVar2 = std::operator<<((ostream *)os,(string *)&local_168);
    (*(this->super_t_generator)._vptr_t_generator[0x1e])(&local_148,this);
    poVar2 = std::operator<<(poVar2,(string *)&local_148);
    poVar2 = std::operator<<(poVar2,"self._processMap[name](self, seqid, iprot, oprot)");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_168);
    t_generator::indent_abi_cxx11_(&local_168,&this->super_t_generator);
    poVar2 = std::operator<<((ostream *)os,(string *)&local_168);
    poVar2 = std::operator<<(poVar2,"return True");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  }
  else {
    t_generator::indent_abi_cxx11_(&local_168,&this->super_t_generator);
    poVar2 = std::operator<<((ostream *)os,(string *)&local_168);
    (*(this->super_t_generator)._vptr_t_generator[0x1e])(&local_148,this);
    poVar2 = std::operator<<(poVar2,(string *)&local_148);
    poVar2 = std::operator<<(poVar2,"return self._processMap[name](self, seqid, iprot, oprot)");
    std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_148);
  }
  std::__cxx11::string::~string((string *)&local_168);
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  for (pptVar4 = local_128._M_impl.super__Vector_impl_data._M_start;
      pptVar4 != local_128._M_impl.super__Vector_impl_data._M_finish; pptVar4 = pptVar4 + 1) {
    tservice_00 = &::endl_abi_cxx11_;
    std::operator<<((ostream *)os,(string *)&::endl_abi_cxx11_);
    generate_process_function(this,(t_service *)tservice_00,*pptVar4);
  }
  piVar1 = &(this->super_t_generator).indent_;
  *piVar1 = *piVar1 + -1;
  std::__cxx11::string::~string((string *)local_110);
  std::__cxx11::string::~string((string *)&local_f0);
  std::_Vector_base<t_function_*,_std::allocator<t_function_*>_>::~_Vector_base(&local_128);
  return;
}

Assistant:

void t_py_generator::generate_service_server(t_service* tservice) {
  // Generate the dispatch methods
  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;

  string extends = "";
  string extends_processor = "";
  if (tservice->get_extends() != nullptr) {
    extends = type_name(tservice->get_extends());
    extends_processor = extends + ".Processor, ";
  }

  f_service_ << endl << endl;

  // Generate the header portion
  if (gen_zope_interface_) {
    f_service_ << "@implementer(Iface)" << endl
               << "class Processor(" << extends_processor << "TProcessor):" << endl;
  } else {
    f_service_ << "class Processor(" << extends_processor << "Iface, TProcessor):" << endl;
  }

  indent_up();

  indent(f_service_) << "def __init__(self, handler):" << endl;
  indent_up();
  if (extends.empty()) {
    if (gen_zope_interface_) {
      f_service_ << indent() << "self._handler = Iface(handler)" << endl;
    } else {
      f_service_ << indent() << "self._handler = handler" << endl;
    }

    f_service_ << indent() << "self._processMap = {}" << endl;
  } else {
    if (gen_zope_interface_) {
      f_service_ << indent() << extends << ".Processor.__init__(self, Iface(handler))" << endl;
    } else {
      f_service_ << indent() << extends << ".Processor.__init__(self, handler)" << endl;
    }
  }
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    f_service_ << indent() << "self._processMap[\"" << (*f_iter)->get_name()
               << "\"] = Processor.process_" << (*f_iter)->get_name() << endl;
  }
  f_service_ << indent() << "self._on_message_begin = None" << endl;
  indent_down();
  f_service_ << endl;

  f_service_ << indent() << "def on_message_begin(self, func):" << endl;
  indent_up();
    f_service_ << indent() << "self._on_message_begin = func" << endl;
  indent_down();
  f_service_ << endl;

  // Generate the server implementation
  f_service_ << indent() << "def process(self, iprot, oprot):" << endl;
  indent_up();

  f_service_ << indent() << "(name, type, seqid) = iprot.readMessageBegin()" << endl;
  f_service_ << indent() << "if self._on_message_begin:" << endl;
  indent_up();
    f_service_ << indent() << "self._on_message_begin(name, type, seqid)" << endl;
  indent_down();

  // TODO(mcslee): validate message

  // HOT: dictionary function lookup
  f_service_ << indent() << "if name not in self._processMap:" << endl;
  indent_up();
  f_service_ << indent() << "iprot.skip(TType.STRUCT)" << endl
             << indent() << "iprot.readMessageEnd()" << endl
             << indent()
             << "x = TApplicationException(TApplicationException.UNKNOWN_METHOD, 'Unknown "
                "function %s' % (name))"
             << endl
             << indent() << "oprot.writeMessageBegin(name, TMessageType.EXCEPTION, seqid)" << endl
             << indent() << "x.write(oprot)" << endl
             << indent() << "oprot.writeMessageEnd()" << endl
             << indent() << "oprot.trans.flush()" << endl;

  if (gen_twisted_) {
    f_service_ << indent() << "return defer.succeed(None)" << endl;
  } else {
    f_service_ << indent() << "return" << endl;
  }
  indent_down();

  f_service_ << indent() << "else:" << endl;

  if (gen_twisted_ || gen_tornado_) {
    f_service_ << indent() << indent_str()
               << "return self._processMap[name](self, seqid, iprot, oprot)" << endl;
  } else {
    f_service_ << indent() << indent_str() << "self._processMap[name](self, seqid, iprot, oprot)"
               << endl;

    // Read end of args field, the T_STOP, and the struct close
    f_service_ << indent() << "return True" << endl;
  }

  indent_down();

  // Generate the process subfunctions
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    f_service_ << endl;
    generate_process_function(tservice, *f_iter);
  }

  indent_down();
}